

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::big_decimal_fp,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,big_decimal_fp *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  int iVar1;
  size_type sVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  int exp;
  long lVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  byte bVar12;
  ptrdiff_t _Num_1;
  ulong uVar13;
  byte *pbVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  size_t sVar18;
  uint uVar19;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  ptrdiff_t _Num;
  size_t sVar23;
  size_t local_58;
  
  iVar1 = fp->significand_size;
  sVar23 = (size_t)iVar1;
  uVar10 = fspecs._4_4_;
  uVar19 = uVar10 >> 8 & 0xff;
  uVar15 = (ulong)uVar19;
  uVar16 = (iVar1 + 1) - (uint)(uVar19 == 0);
  uVar17 = (ulong)uVar16;
  pcVar20 = fp->significand;
  uVar22 = fp->exponent;
  uVar9 = uVar22 + iVar1;
  uVar21 = fspecs.precision;
  if (fspecs._4_1_ == '\x01') {
LAB_00192004:
    exp = uVar22 + iVar1 + -1;
    if ((uVar10 >> 0x14 & 1) == 0) {
      local_58 = 0;
      if (iVar1 == 1) {
        decimal_point = '\0';
      }
    }
    else {
      local_58 = 0;
      if (0 < (int)(uVar21 - iVar1)) {
        local_58 = (size_t)(uVar21 - iVar1);
      }
      uVar17 = uVar17 + local_58;
    }
    iVar3 = 1 - uVar9;
    if (0 < (int)uVar9) {
      iVar3 = exp;
    }
    lVar8 = 2;
    if (99 < iVar3) {
      lVar8 = (ulong)(999 < iVar3) + 3;
    }
    uVar17 = (3 - (ulong)(decimal_point == '\0')) + uVar17 + lVar8;
    bVar12 = ((uVar10 >> 0x10 & 1) == 0) << 5 | 0x45;
    uVar5 = (ulong)specs->width;
    if ((long)uVar5 < 1) {
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::string::resize((ulong)out.container,(char)uVar17 + (char)sVar2);
      pcVar4 = ((out.container)->_M_dataplus)._M_p + sVar2;
      if (uVar19 != 0) {
        *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar15);
        pcVar4 = pcVar4 + 1;
      }
      *pcVar4 = *pcVar20;
      if (decimal_point == '\0') {
        pbVar14 = (byte *)(pcVar4 + 1);
      }
      else {
        pcVar4[1] = decimal_point;
        if (iVar1 != 1) {
          memmove(pcVar4 + 2,pcVar20 + 1,sVar23 - 1);
        }
        pbVar14 = (byte *)(pcVar4 + 2 + (sVar23 - 1));
      }
      pbVar11 = pbVar14;
      if ((int)local_58 != 0) {
        pbVar11 = pbVar14 + local_58;
        memset(pbVar14,0x30,local_58);
      }
      *pbVar11 = bVar12;
      write_exponent<char,char*>(exp,(char *)(pbVar11 + 1));
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )out.container;
    }
    uVar13 = 0;
    if (uVar17 <= uVar5) {
      uVar13 = uVar5 - uVar17;
    }
    uVar5 = uVar13 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar2 = (out.container)->_M_string_length;
    std::__cxx11::string::resize
              ((ulong)out.container,(char)uVar17 + (char)sVar2 + (specs->fill).size_ * (char)uVar13)
    ;
    pcVar4 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar5,&specs->fill);
    if (uVar19 != 0) {
      *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar15);
      pcVar4 = pcVar4 + 1;
    }
    *pcVar4 = *pcVar20;
    if (decimal_point == '\0') {
      pbVar14 = (byte *)(pcVar4 + 1);
    }
    else {
      pcVar4[1] = decimal_point;
      if (iVar1 != 1) {
        memmove(pcVar4 + 2,pcVar20 + 1,sVar23 - 1);
      }
      pbVar14 = (byte *)(pcVar4 + 2 + (sVar23 - 1));
    }
    pbVar11 = pbVar14;
    if ((int)local_58 != 0) {
      pbVar11 = pbVar14 + local_58;
      memset(pbVar14,0x30,local_58);
    }
    *pbVar11 = bVar12;
    pcVar4 = write_exponent<char,char*>(exp,(char *)(pbVar11 + 1));
    sVar18 = uVar13 - uVar5;
LAB_00192350:
    fill<char*,char>(pcVar4,sVar18,&specs->fill);
  }
  else {
    if (((ulong)fspecs & 0xff00000000) == 0) {
      uVar7 = 0x10;
      if (0 < (int)uVar21) {
        uVar7 = uVar21;
      }
      if (((int)uVar9 < -3) || ((int)uVar7 < (int)uVar9)) goto LAB_00192004;
    }
    if ((int)uVar22 < 0) {
      if ((int)uVar9 < 1) {
        uVar10 = -uVar9;
        uVar22 = uVar10;
        if (SBORROW4(uVar21,uVar10) != (int)(uVar21 + uVar9) < 0) {
          uVar22 = uVar21;
        }
        if (iVar1 != 0) {
          uVar22 = uVar10;
        }
        if ((int)uVar21 < 0) {
          uVar22 = uVar10;
        }
        uVar17 = (uVar22 + 2) + uVar17;
        uVar5 = 0;
        if (uVar17 <= (uint)specs->width) {
          uVar5 = (uint)specs->width - uVar17;
        }
        uVar13 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                    (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
        sVar2 = (out.container)->_M_string_length;
        std::__cxx11::string::resize
                  ((ulong)out.container,
                   (char)uVar17 + (char)sVar2 + (specs->fill).size_ * (char)uVar5);
        pcVar6 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar13,&specs->fill);
        if (uVar19 != 0) {
          *pcVar6 = *(char *)((long)&basic_data<void>::signs + uVar15);
          pcVar6 = pcVar6 + 1;
        }
        *pcVar6 = '0';
        if (uVar22 == 0) {
          if (((ulong)fspecs & 0x10000000000000) != 0 || iVar1 != 0) {
            pcVar6[1] = decimal_point;
            pcVar4 = pcVar6 + 2;
            goto LAB_001924b0;
          }
          pcVar4 = pcVar6 + 1;
        }
        else {
          pcVar6[1] = decimal_point;
          pcVar6 = pcVar6 + 2;
          pcVar4 = pcVar6;
          if (0 < (int)uVar22) {
            pcVar4 = pcVar6 + uVar22;
            memset(pcVar6,0x30,(ulong)uVar22);
          }
LAB_001924b0:
          if (iVar1 != 0) {
            memmove(pcVar4,pcVar20,sVar23);
          }
          pcVar4 = pcVar4 + sVar23;
        }
        sVar18 = uVar5 - uVar13;
        goto LAB_00192350;
      }
      uVar22 = uVar21 - iVar1 & (int)(uVar10 << 0xb) >> 0x1f;
      uVar5 = 0;
      if (0 < (int)uVar22) {
        uVar5 = (ulong)uVar22;
      }
      uVar13 = uVar5 + uVar17 + 1;
      uVar17 = 0;
      if (uVar13 <= (uint)specs->width) {
        uVar17 = (uint)specs->width - uVar13;
      }
      uVar13 = uVar17 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::string::resize
                ((ulong)out.container,
                 (char)sVar2 + (char)uVar5 + (char)uVar16 + '\x01' +
                 (specs->fill).size_ * (char)uVar17);
      pcVar4 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar13,&specs->fill);
      if (uVar19 != 0) {
        *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar15);
        pcVar4 = pcVar4 + 1;
      }
      uVar15 = (ulong)uVar9;
      memmove(pcVar4,pcVar20,uVar15);
      pcVar4 = pcVar4 + uVar15;
      if (decimal_point != '\0') {
        *pcVar4 = decimal_point;
        memmove(pcVar4 + 1,pcVar20 + uVar15,sVar23 - uVar15);
        pcVar4 = pcVar4 + (sVar23 - uVar15) + 1;
      }
      pcVar20 = pcVar4;
      if (0 < (int)uVar22) {
        pcVar20 = pcVar4 + uVar22;
        memset(pcVar4,0x30,(ulong)uVar22);
      }
      sVar18 = uVar17 - uVar13;
    }
    else {
      uVar17 = uVar17 + uVar22;
      uVar21 = uVar21 - uVar9;
      if (((uVar10 >> 0x14 & 1) != 0) && (0 < (int)uVar21 || (uVar10 & 0xff) != 2)) {
        uVar22 = 1;
        if (0 < (int)uVar21) {
          uVar22 = uVar21;
        }
        if ((uVar10 & 0xff) == 2) {
          uVar22 = uVar21;
        }
        uVar21 = uVar22;
        uVar17 = uVar17 + uVar21;
      }
      uVar5 = 0;
      if (uVar17 <= (uint)specs->width) {
        uVar5 = (uint)specs->width - uVar17;
      }
      uVar13 = uVar5 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                  (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
      sVar2 = (out.container)->_M_string_length;
      std::__cxx11::string::resize
                ((ulong)out.container,(char)uVar17 + (char)sVar2 + (specs->fill).size_ * (char)uVar5
                );
      pcVar4 = fill<char*,char>(((out.container)->_M_dataplus)._M_p + sVar2,uVar13,&specs->fill);
      if (uVar19 != 0) {
        *pcVar4 = *(char *)((long)&basic_data<void>::signs + uVar15);
        pcVar4 = pcVar4 + 1;
      }
      if (iVar1 != 0) {
        memmove(pcVar4,pcVar20,sVar23);
      }
      pcVar4 = pcVar4 + sVar23;
      sVar23 = (size_t)fp->exponent;
      pcVar20 = pcVar4;
      if (0 < (long)sVar23) {
        pcVar20 = pcVar4 + sVar23;
        memset(pcVar4,0x30,sVar23);
      }
      if ((uVar10 >> 0x14 & 1) != 0) {
        *pcVar20 = decimal_point;
        pcVar4 = pcVar20 + 1;
        pcVar20 = pcVar4;
        if (0 < (int)uVar21) {
          pcVar20 = pcVar4 + uVar21;
          memset(pcVar4,0x30,(ulong)uVar21);
        }
      }
      sVar18 = uVar5 - uVar13;
    }
    fill<char*,char>(pcVar20,sVar18,&specs->fill);
  }
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )out.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}